

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O2

char * trimWhitespace(char *str)

{
  ushort **ppuVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  char *__s;
  
  ppuVar1 = __ctype_b_loc();
  __s = gToOpen + 15999;
  do {
    pcVar4 = __s;
    __s = pcVar4 + 1;
  } while ((*(byte *)((long)*ppuVar1 + (long)pcVar4[1] * 2 + 1) & 0x20) != 0);
  if (pcVar4[1] != '\0') {
    sVar2 = strlen(__s);
    uVar3 = sVar2 & 0xffffffff;
    while ((0 < (int)uVar3 &&
           ((*(byte *)((long)*ppuVar1 + (long)pcVar4[uVar3] * 2 + 1) & 0x20) != 0))) {
      pcVar4[uVar3] = '\0';
      uVar3 = uVar3 - 1;
    }
  }
  return __s;
}

Assistant:

static char *trimWhitespace( char *str )
{
   int i;

   if( !str ) return str;

   while( isspace(*str) ) str++;
   if( *str == '\0' ) return str;

   for( i=(int)strlen(str)-1; i >= 0; i-- )
   {
      if( !isspace(str[i]) )
         return str;
      str[i] = '\0';
   }

   return str;
}